

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_glnodes.cpp
# Opt level: O0

bool MatchHeader(char *label,char *hdata)

{
  int iVar1;
  size_t b;
  unsigned_long __n;
  size_t labellen;
  char *hdata_local;
  char *label_local;
  
  iVar1 = memcmp(hdata,"LEVEL=",6);
  if (iVar1 == 0) {
    b = strlen(label);
    __n = MIN<unsigned_long>(8,b);
    iVar1 = strncasecmp(hdata + 6,label,__n);
    if ((iVar1 == 0) && ((hdata[__n + 6] == '\n' || (hdata[__n + 6] == '\r')))) {
      return true;
    }
  }
  return false;
}

Assistant:

static bool MatchHeader(const char * label, const char * hdata)
{
	if (memcmp(hdata, "LEVEL=", 6) == 0)
	{
		size_t labellen = strlen(label);
		labellen = MIN(size_t(8), labellen);

		if (strnicmp(hdata+6, label, labellen)==0 && 
			(hdata[6+labellen]==0xa || hdata[6+labellen]==0xd))
		{
			return true;
		}
	}
	return false;
}